

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,SPxLPBase<double> *lp,int _i,bool lhsFixed,
          DataArray<bool> *fixCols,Array<double> *lo,Array<double> *up,
          shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  VectorBase<double> *pVVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b1a18;
  (this->super_PostStep).m_name = "ForceConstraint";
  (this->super_PostStep).nCols = iVar3;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ForceConstraintPS_003b1df8;
  this->m_i = _i;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar5 = &(lp->super_LPRowSetBase<double>).right;
  if (lhsFixed) {
    pVVar5 = &(lp->super_LPRowSetBase<double>).left;
  }
  this->m_lRhs = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[_i];
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_row,
             (SVectorBase<double> *)
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx));
  Array<double>::Array
            (&this->m_objs,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  DataArray<bool>::DataArray(&this->m_fixed,fixCols);
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_cols,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  this->m_lhsFixed = lhsFixed;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  Array<double>::Array(&this->m_oldLowers,lo);
  Array<double>::Array(&this->m_oldUppers,up);
  this->m_lhs = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  this->m_rhs = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  dVar1 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  uVar9 = (uint)((ulong)dVar1 >> 0x20);
  if (lp->thesense == MINIMIZE) {
    uVar9 = uVar9 ^ 0x80000000;
  }
  this->m_rowobj = (double)CONCAT44(uVar9,SUB84(dVar1,0));
  if (0 < (this->m_row).super_SVectorBase<double>.memused) {
    lVar8 = 8;
    lVar7 = 0;
    lVar6 = 0;
    do {
      (this->m_objs).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6] =
           -(lp->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[*(int *)((long)&((this->m_row).super_SVectorBase<double>.m_elem)->val + lVar8)]
      ;
      DSVectorBase<double>::operator=
                ((DSVectorBase<double> *)
                 ((long)&((this->m_cols).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar7),
                 (SVectorBase<double> *)
                 ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                 [*(int *)((long)&((this->m_row).super_SVectorBase<double>.m_elem)->val + lVar8)].
                 idx));
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0x10;
      lVar7 = lVar7 + 0x20;
    } while (lVar6 < (this->m_row).super_SVectorBase<double>.memused);
  }
  return;
}

Assistant:

ForceConstraintPS(const SPxLPBase<R>& lp, int _i, bool lhsFixed,
                        DataArray<bool>& fixCols,
                        Array<R>& lo, Array<R>& up, std::shared_ptr<Tolerances> tols)
         : PostStep("ForceConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_lRhs(lhsFixed ? lp.lhs(_i) : lp.rhs(_i))
         , m_row(lp.rowVector(_i))
         , m_objs(lp.rowVector(_i).size())
         , m_fixed(fixCols)
         , m_cols(lp.rowVector(_i).size())
         , m_lhsFixed(lhsFixed)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_oldLowers(lo)
         , m_oldUppers(up)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_rowobj(lp.rowObj(_i))
      {
         for(int k = 0; k < m_row.size(); ++k)
         {
            m_objs[k] = (lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(m_row.index(k)) : -lp.obj(m_row.index(
                            k)));
            m_cols[k] = lp.colVector(m_row.index(k));
         }
      }